

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O2

void __thiscall ImgfsFile::NameEntry::getdata(NameEntry *this,uint8_t *p,ImgfsFile *param_2)

{
  Wstring wstr;
  
  *(uint32_t *)p = (this->super_DirEntry)._magic;
  ToWString<char>(&wstr,&this->_name);
  std::__cxx11::
  basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>::
  resize(&wstr,0x18);
  if (wstr._M_string_length != 0) {
    memmove(p + 4,wstr._M_dataplus._M_p,wstr._M_string_length * 2);
  }
  std::__cxx11::
  basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>::
  ~basic_string(&wstr);
  return;
}

Assistant:

virtual void getdata(uint8_t* p, ImgfsFile& /*imgfs*/)
        {
            set32le(p, _magic);
            std::Wstring wstr= ToWString(_name);
            wstr.resize(24);
            // note: nonportable endian cast
            std::copy(wstr.begin(), wstr.end(), (WCHAR*)(p+4));
        }